

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::end
          (QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *this)

{
  pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *n;
  QArrayDataPointer<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>
  *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *)0x7df499);
  QArrayDataPointer<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::
  operator->(in_RDI);
  n = QArrayDataPointer<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::end
                (in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }